

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validity_mask.hpp
# Opt level: O3

idx_t duckdb::WindowBoundariesState::FindNextStart(ValidityMask *mask,idx_t l,idx_t r,idx_t *n)

{
  unsigned_long *puVar1;
  ulong uVar2;
  idx_t iVar3;
  ulong uVar4;
  
  puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar1 == (unsigned_long *)0x0) {
    uVar2 = *n;
    uVar4 = (l + uVar2) - 1;
    if (r <= uVar4) {
      uVar4 = r;
    }
    iVar3 = 0;
    if (r - l <= uVar2) {
      iVar3 = uVar2 - (r - l);
    }
    *n = iVar3;
    return uVar4;
  }
  if (l < r) {
    iVar3 = *n;
    do {
      uVar4 = (ulong)((uint)l & 0x3f);
      uVar2 = puVar1[l >> 6];
      if (uVar2 == 0 && uVar4 == 0) {
        l = l + 0x40;
      }
      else {
        while (l < r) {
          if ((uVar2 >> (uVar4 & 0x3f) & 1) != 0) {
            iVar3 = iVar3 - 1;
            *n = iVar3;
            if (iVar3 == 0) {
              return l;
            }
          }
          l = l + 1;
          if (0x3e < uVar4) break;
          uVar4 = uVar4 + 1;
        }
      }
    } while (l < r);
  }
  return r;
}

Assistant:

inline bool AllValid() const {
		return !validity_mask;
	}